

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

int aom_satd_lp_sse2(int16_t *coeff,int length)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int in_ESI;
  undefined8 *in_RDI;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  __m128i src_line1;
  __m128i src_line0;
  int i;
  __m128i accum;
  __m128i one;
  __m128i zero;
  int local_21c;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  undefined8 *local_1e0;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  __m128i hi;
  __m128i sum1;
  __m128i sum0;
  __m128i abs1;
  __m128i abs0;
  __m128i inv1;
  __m128i inv0;
  
  local_218 = 0;
  iStack_214 = 0;
  iStack_210 = 0;
  iStack_20c = 0;
  local_1e0 = in_RDI;
  for (local_21c = 0; local_21c < in_ESI; local_21c = local_21c + 0x10) {
    uVar17 = *local_1e0;
    uVar18 = local_1e0[1];
    uVar19 = local_1e0[2];
    uVar20 = local_1e0[3];
    local_128 = (short)uVar17;
    sStack_126 = (short)((ulong)uVar17 >> 0x10);
    sStack_124 = (short)((ulong)uVar17 >> 0x20);
    sStack_122 = (short)((ulong)uVar17 >> 0x30);
    sStack_120 = (short)uVar18;
    sStack_11e = (short)((ulong)uVar18 >> 0x10);
    sStack_11c = (short)((ulong)uVar18 >> 0x20);
    sStack_11a = (short)((ulong)uVar18 >> 0x30);
    sVar1 = -local_128;
    sVar2 = -sStack_126;
    sVar3 = -sStack_124;
    sVar4 = -sStack_122;
    sVar5 = -sStack_120;
    sVar6 = -sStack_11e;
    sVar7 = -sStack_11c;
    sVar8 = -sStack_11a;
    local_148 = (short)uVar19;
    sStack_146 = (short)((ulong)uVar19 >> 0x10);
    sStack_144 = (short)((ulong)uVar19 >> 0x20);
    sStack_142 = (short)((ulong)uVar19 >> 0x30);
    sStack_140 = (short)uVar20;
    sStack_13e = (short)((ulong)uVar20 >> 0x10);
    sStack_13c = (short)((ulong)uVar20 >> 0x20);
    sStack_13a = (short)((ulong)uVar20 >> 0x30);
    sVar9 = -local_148;
    sVar10 = -sStack_146;
    sVar11 = -sStack_144;
    sVar12 = -sStack_142;
    sVar13 = -sStack_140;
    sVar14 = -sStack_13e;
    sVar15 = -sStack_13c;
    sVar16 = -sStack_13a;
    auVar22._2_2_ =
         (ushort)(sStack_126 < sVar2) * sVar2 | (ushort)(sStack_126 >= sVar2) * sStack_126;
    auVar22._0_2_ = (ushort)(local_128 < sVar1) * sVar1 | (ushort)(local_128 >= sVar1) * local_128;
    auVar22._4_2_ =
         (ushort)(sStack_124 < sVar3) * sVar3 | (ushort)(sStack_124 >= sVar3) * sStack_124;
    auVar22._6_2_ =
         (ushort)(sStack_122 < sVar4) * sVar4 | (ushort)(sStack_122 >= sVar4) * sStack_122;
    auVar22._10_2_ =
         (ushort)(sStack_11e < sVar6) * sVar6 | (ushort)(sStack_11e >= sVar6) * sStack_11e;
    auVar22._8_2_ =
         (ushort)(sStack_120 < sVar5) * sVar5 | (ushort)(sStack_120 >= sVar5) * sStack_120;
    auVar22._12_2_ =
         (ushort)(sStack_11c < sVar7) * sVar7 | (ushort)(sStack_11c >= sVar7) * sStack_11c;
    auVar22._14_2_ =
         (ushort)(sStack_11a < sVar8) * sVar8 | (ushort)(sStack_11a >= sVar8) * sStack_11a;
    auVar23._8_8_ = 0x1000100010001;
    auVar23._0_8_ = 0x1000100010001;
    auVar23 = pmaddwd(auVar22,auVar23);
    auVar21._2_2_ =
         (ushort)(sStack_146 < sVar10) * sVar10 | (ushort)(sStack_146 >= sVar10) * sStack_146;
    auVar21._0_2_ = (ushort)(local_148 < sVar9) * sVar9 | (ushort)(local_148 >= sVar9) * local_148;
    auVar21._4_2_ =
         (ushort)(sStack_144 < sVar11) * sVar11 | (ushort)(sStack_144 >= sVar11) * sStack_144;
    auVar21._6_2_ =
         (ushort)(sStack_142 < sVar12) * sVar12 | (ushort)(sStack_142 >= sVar12) * sStack_142;
    auVar21._10_2_ =
         (ushort)(sStack_13e < sVar14) * sVar14 | (ushort)(sStack_13e >= sVar14) * sStack_13e;
    auVar21._8_2_ =
         (ushort)(sStack_140 < sVar13) * sVar13 | (ushort)(sStack_140 >= sVar13) * sStack_140;
    auVar21._12_2_ =
         (ushort)(sStack_13c < sVar15) * sVar15 | (ushort)(sStack_13c >= sVar15) * sStack_13c;
    auVar21._14_2_ =
         (ushort)(sStack_13a < sVar16) * sVar16 | (ushort)(sStack_13a >= sVar16) * sStack_13a;
    auVar24._8_8_ = 0x1000100010001;
    auVar24._0_8_ = 0x1000100010001;
    auVar24 = pmaddwd(auVar21,auVar24);
    local_a8 = auVar23._0_4_;
    iStack_a4 = auVar23._4_4_;
    iStack_a0 = auVar23._8_4_;
    iStack_9c = auVar23._12_4_;
    local_c8 = auVar24._0_4_;
    iStack_c4 = auVar24._4_4_;
    iStack_c0 = auVar24._8_4_;
    iStack_bc = auVar24._12_4_;
    local_218 = local_218 + local_a8 + local_c8;
    iStack_214 = iStack_214 + iStack_a4 + iStack_c4;
    iStack_210 = iStack_210 + iStack_a0 + iStack_c0;
    iStack_20c = iStack_20c + iStack_9c + iStack_bc;
    local_1e0 = local_1e0 + 4;
  }
  return local_218 + iStack_210 + iStack_214 + iStack_20c;
}

Assistant:

int aom_satd_lp_sse2(const int16_t *coeff, int length) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  __m128i accum = zero;

  for (int i = 0; i < length; i += 16) {
    const __m128i src_line0 = _mm_loadu_si128((const __m128i *)coeff);
    const __m128i src_line1 = _mm_loadu_si128((const __m128i *)(coeff + 8));
    const __m128i inv0 = _mm_sub_epi16(zero, src_line0);
    const __m128i inv1 = _mm_sub_epi16(zero, src_line1);
    const __m128i abs0 = _mm_max_epi16(src_line0, inv0);  // abs(src_line)
    const __m128i abs1 = _mm_max_epi16(src_line1, inv1);  // abs(src_line)
    const __m128i sum0 = _mm_madd_epi16(abs0, one);
    const __m128i sum1 = _mm_madd_epi16(abs1, one);
    accum = _mm_add_epi32(accum, sum0);
    accum = _mm_add_epi32(accum, sum1);
    coeff += 16;
  }

  {  // cascading summation of accum
    __m128i hi = _mm_srli_si128(accum, 8);
    accum = _mm_add_epi32(accum, hi);
    hi = _mm_srli_epi64(accum, 32);
    accum = _mm_add_epi32(accum, hi);
  }

  return _mm_cvtsi128_si32(accum);
}